

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_mvcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  uint64_t uVar1;
  _Bool _Var2;
  int mmu_idx_00;
  CPUState *cpu;
  uint64_t uVar3;
  uintptr_t unaff_retaddr;
  uint local_178;
  uint local_170;
  ulong local_168;
  ulong local_160;
  ulong local_150;
  S390Access local_130;
  S390Access local_108;
  S390Access local_e0;
  uint local_b8;
  uint32_t local_b4;
  uint32_t cur_len;
  uint32_t cc;
  S390Access desta;
  S390Access srca;
  CPUState *cs;
  uint64_t uStack_50;
  uint8_t pad;
  uint64_t src;
  uint64_t srclen;
  uint64_t dest;
  uint64_t destlen;
  uintptr_t ra;
  int mmu_idx;
  uint32_t r2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  dest = env->regs[r1 + 1] & 0xffffff;
  srclen = get_address(env,r1);
  src = env->regs[r2 + 1] & 0xffffff;
  uStack_50 = get_address(env,r2);
  uVar1 = env->regs[r2 + 1];
  cpu = env_cpu(env);
  local_150 = dest;
  if (src < dest) {
    local_150 = src;
  }
  _Var2 = is_destructive_overlap(env,srclen,uStack_50,(uint32_t)local_150);
  if (_Var2) {
    local_b4 = 3;
  }
  else if (src == dest) {
    local_b4 = 0;
  }
  else if (dest < src) {
    local_b4 = 1;
  }
  else {
    local_b4 = 2;
  }
  if (dest == 0 || local_b4 == 3) {
    set_address_zero(env,r2,uStack_50);
    set_address_zero(env,r1,srclen);
    env_local._4_4_ = local_b4;
  }
  else {
    if (src == 0) {
      set_address_zero(env,r2,uStack_50);
    }
    while (dest != 0) {
      if (dest < -(srclen | 0xfffffffffffff000)) {
        local_160 = dest;
      }
      else {
        local_160 = -(srclen | 0xfffffffffffff000);
      }
      local_b8 = (uint)local_160;
      if (src == 0) {
        access_prepare(&local_e0,env,srclen,local_b8,MMU_DATA_STORE,mmu_idx_00,unaff_retaddr);
        memcpy(&cur_len,&local_e0,0x28);
        access_memset(env,(S390Access *)&cur_len,(uint8_t)(uVar1 >> 0x18),unaff_retaddr);
      }
      else {
        if (src < -(uStack_50 | 0xfffffffffffff000)) {
          local_168 = src;
        }
        else {
          local_168 = -(uStack_50 | 0xfffffffffffff000);
        }
        local_178 = local_b8;
        if (local_168 < (local_160 & 0xffffffff)) {
          if (src < -(uStack_50 | 0xfffffffffffff000)) {
            local_170 = (uint)src;
          }
          else {
            local_170 = -((uint)uStack_50 | 0xfffff000);
          }
          local_178 = local_170;
        }
        local_b8 = local_178;
        access_prepare(&local_108,env,uStack_50,local_178,MMU_DATA_LOAD,mmu_idx_00,unaff_retaddr);
        memcpy(&desta.size1,&local_108,0x28);
        access_prepare(&local_130,env,srclen,local_b8,MMU_DATA_STORE,mmu_idx_00,unaff_retaddr);
        memcpy(&cur_len,&local_130,0x28);
        access_memmove(env,(S390Access *)&cur_len,(S390Access *)&desta.size1,unaff_retaddr);
        uStack_50 = wrap_address(env,uStack_50 + local_b8);
        src = src - local_b8;
        uVar3 = deposit64(env->regs[r2 + 1],0,0x18,src);
        env->regs[r2 + 1] = uVar3;
        set_address_zero(env,r2,uStack_50);
      }
      srclen = wrap_address(env,srclen + local_b8);
      dest = dest - local_b8;
      uVar3 = deposit64(env->regs[r1 + 1],0,0x18,dest);
      env->regs[r1 + 1] = uVar3;
      set_address_zero(env,r1,srclen);
      if ((dest != 0) && (_Var2 = cpu_loop_exit_requested(cpu), _Var2)) {
        cpu_loop_exit_restore_s390x(cpu,unaff_retaddr);
      }
    }
    env_local._4_4_ = local_b4;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(mvcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    uintptr_t ra = GETPC();
    uint64_t destlen = env->regs[r1 + 1] & 0xffffff;
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = env->regs[r2 + 1] & 0xffffff;
    uint64_t src = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    CPUState *cs = env_cpu(env);
    S390Access srca, desta;
    uint32_t cc, cur_len;

    if (is_destructive_overlap(env, dest, src, MIN(srclen, destlen))) {
        cc = 3;
    } else if (srclen == destlen) {
        cc = 0;
    } else if (destlen < srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    /* We might have to zero-out some bits even if there was no action. */
    if (unlikely(!destlen || cc == 3)) {
        set_address_zero(env, r2, src);
        set_address_zero(env, r1, dest);
        return cc;
    } else if (!srclen) {
        set_address_zero(env, r2, src);
    }

    /*
     * Only perform one type of type of operation (move/pad) in one step.
     * Stay within single pages.
     */
    while (destlen) {
        cur_len = MIN(destlen, -(dest | TARGET_PAGE_MASK));
        if (!srclen) {
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memset(env, &desta, pad, ra);
        } else {
            cur_len = MIN(MIN(srclen, -(src | TARGET_PAGE_MASK)), cur_len);

            srca = access_prepare(env, src, cur_len, MMU_DATA_LOAD, mmu_idx,
                                  ra);
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memmove(env, &desta, &srca, ra);
            src = wrap_address(env, src + cur_len);
            srclen -= cur_len;
            env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, srclen);
            set_address_zero(env, r2, src);
        }
        dest = wrap_address(env, dest + cur_len);
        destlen -= cur_len;
        env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, destlen);
        set_address_zero(env, r1, dest);

        /*
         * MVCL is interruptible. Return to the main loop if requested after
         * writing back all state to registers. If no interrupt will get
         * injected, we'll end up back in this handler and continue processing
         * the remaining parts.
         */
        if (destlen && unlikely(cpu_loop_exit_requested(cs))) {
            cpu_loop_exit_restore(cs, ra);
        }
    }
    return cc;
}